

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# record-replay.cpp
# Opt level: O2

replay_entry_t * __thiscall replay_entry_t::next_entry(replay_entry_t *this)

{
  replay_entry_t *prVar1;
  replay_entry_t *entry;
  
  if (this->m_type != ped_type_last) {
    prVar1 = this + 1;
    do {
      this = prVar1;
      if (this->m_type != ped_type_orphaned) {
        return this;
      }
      prVar1 = this + 1;
    } while (this->m_value == -1);
  }
  return this;
}

Assistant:

replay_entry_t *next_entry()
    {
        replay_entry_t *entry = this;

        // You can't go beyond the end
        if (ped_type_last == entry->m_type)
            return entry;

        // Advance to the next entry
        entry++;

        // Skip any ORPHANED records that don't have a matching steal. We
        // initialized the value field to -1 for ORPHANED.  After loading all
        // the log data, we iterated through all the STEAL records setting the
        // matching ORPHANED record's value field to 0. So if an ORPHANED
        // record's value field is still -1, it doesn't have a matching STEAL
        // record, and I don't know why we chose not to return from the
        // spawned function.
        while ((ped_type_orphaned == entry->m_type) && (-1 == entry->m_value))
        {
            entry++;
        }

        return entry;
    }